

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.h
# Opt level: O3

void __thiscall benchmark::BenchmarkReporter::Run::~Run(Run *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->report_label)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->report_label).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->benchmark_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->benchmark_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Run() :
      iterations(1),
      real_accumulated_time(0),
      cpu_accumulated_time(0),
      bytes_per_second(0),
      items_per_second(0),
      max_heapbytes_used(0) {}